

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler,bool isKey)

{
  byte *pbVar1;
  byte *pbVar2;
  undefined1 (*pauVar3) [16];
  char *pcVar4;
  ushort uVar5;
  undefined1 auVar6 [16];
  Stack<rapidjson::CrtAllocator> *pSVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  byte *pbVar12;
  ulong count;
  size_t escapeOffset;
  byte bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  StackStream<char> stackStream;
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> copy;
  StackStream<char> local_78;
  GenericStringStream<rapidjson::UTF8<char>_> local_68;
  GenericStringStream<rapidjson::UTF8<char>_> *local_58;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *local_50;
  byte local_48;
  byte bStack_47;
  byte bStack_46;
  byte bStack_45;
  byte bStack_44;
  byte bStack_43;
  byte bStack_42;
  byte bStack_41;
  byte bStack_40;
  byte bStack_3f;
  byte bStack_3e;
  byte bStack_3d;
  byte bStack_3c;
  byte bStack_3b;
  byte bStack_3a;
  byte bStack_39;
  
  local_68.src_ = (*is).src_;
  local_68.src_ = local_68.src_ + 1;
  local_68.head_ = (*is).head_;
  local_78.length_ = 0;
  local_78.stack_ = (Stack<rapidjson::CrtAllocator> *)this;
  local_58 = is;
  local_50 = handler;
LAB_0014202c:
  do {
    pbVar1 = (byte *)(local_68.src_ + 0xf);
    for (pbVar12 = (byte *)local_68.src_; pSVar7 = local_78.stack_,
        pbVar12 != (byte *)((ulong)pbVar1 & 0xfffffffffffffff0); pbVar12 = pbVar12 + 1) {
      bVar13 = *pbVar12;
      if (((bVar13 == 0x22) || (bVar13 == 0x5c)) || (bVar13 < 0x20)) goto LAB_0014219b;
      if ((local_78.stack_)->stackEnd_ == (local_78.stack_)->stackTop_ ||
          (long)(local_78.stack_)->stackEnd_ - (long)(local_78.stack_)->stackTop_ < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,1);
      }
      pbVar2 = (byte *)pSVar7->stackTop_;
      pSVar7->stackTop_ = (char *)(pbVar2 + 1);
      *pbVar2 = bVar13;
      local_78.length_ = local_78.length_ + 1;
    }
    while( true ) {
      pSVar7 = local_78.stack_;
      local_48 = *pbVar12;
      bStack_47 = pbVar12[1];
      bStack_46 = pbVar12[2];
      bStack_45 = pbVar12[3];
      bStack_44 = pbVar12[4];
      bStack_43 = pbVar12[5];
      bStack_42 = pbVar12[6];
      bStack_41 = pbVar12[7];
      bStack_40 = pbVar12[8];
      bStack_3f = pbVar12[9];
      bStack_3e = pbVar12[10];
      bStack_3d = pbVar12[0xb];
      bStack_3c = pbVar12[0xc];
      bStack_3b = pbVar12[0xd];
      bStack_3a = pbVar12[0xe];
      bStack_39 = pbVar12[0xf];
      auVar14[0] = -(local_48 == 0x22);
      auVar14[1] = -(bStack_47 == 0x22);
      auVar14[2] = -(bStack_46 == 0x22);
      auVar14[3] = -(bStack_45 == 0x22);
      auVar14[4] = -(bStack_44 == 0x22);
      auVar14[5] = -(bStack_43 == 0x22);
      auVar14[6] = -(bStack_42 == 0x22);
      auVar14[7] = -(bStack_41 == 0x22);
      auVar14[8] = -(bStack_40 == 0x22);
      auVar14[9] = -(bStack_3f == 0x22);
      auVar14[10] = -(bStack_3e == 0x22);
      auVar14[0xb] = -(bStack_3d == 0x22);
      auVar14[0xc] = -(bStack_3c == 0x22);
      auVar14[0xd] = -(bStack_3b == 0x22);
      auVar14[0xe] = -(bStack_3a == 0x22);
      auVar14[0xf] = -(bStack_39 == 0x22);
      auVar16[0] = -(local_48 == 0x5c);
      auVar16[1] = -(bStack_47 == 0x5c);
      auVar16[2] = -(bStack_46 == 0x5c);
      auVar16[3] = -(bStack_45 == 0x5c);
      auVar16[4] = -(bStack_44 == 0x5c);
      auVar16[5] = -(bStack_43 == 0x5c);
      auVar16[6] = -(bStack_42 == 0x5c);
      auVar16[7] = -(bStack_41 == 0x5c);
      auVar16[8] = -(bStack_40 == 0x5c);
      auVar16[9] = -(bStack_3f == 0x5c);
      auVar16[10] = -(bStack_3e == 0x5c);
      auVar16[0xb] = -(bStack_3d == 0x5c);
      auVar16[0xc] = -(bStack_3c == 0x5c);
      auVar16[0xd] = -(bStack_3b == 0x5c);
      auVar16[0xe] = -(bStack_3a == 0x5c);
      auVar16[0xf] = -(bStack_39 == 0x5c);
      auVar15[0] = -((byte)((0x1f < local_48) * '\x1f' | (0x1f >= local_48) * local_48) == local_48)
      ;
      auVar15[1] = -((byte)((0x1f < bStack_47) * '\x1f' | (0x1f >= bStack_47) * bStack_47) ==
                    bStack_47);
      auVar15[2] = -((byte)((0x1f < bStack_46) * '\x1f' | (0x1f >= bStack_46) * bStack_46) ==
                    bStack_46);
      auVar15[3] = -((byte)((0x1f < bStack_45) * '\x1f' | (0x1f >= bStack_45) * bStack_45) ==
                    bStack_45);
      auVar15[4] = -((byte)((0x1f < bStack_44) * '\x1f' | (0x1f >= bStack_44) * bStack_44) ==
                    bStack_44);
      auVar15[5] = -((byte)((0x1f < bStack_43) * '\x1f' | (0x1f >= bStack_43) * bStack_43) ==
                    bStack_43);
      auVar15[6] = -((byte)((0x1f < bStack_42) * '\x1f' | (0x1f >= bStack_42) * bStack_42) ==
                    bStack_42);
      auVar15[7] = -((byte)((0x1f < bStack_41) * '\x1f' | (0x1f >= bStack_41) * bStack_41) ==
                    bStack_41);
      auVar15[8] = -((byte)((0x1f < bStack_40) * '\x1f' | (0x1f >= bStack_40) * bStack_40) ==
                    bStack_40);
      auVar15[9] = -((byte)((0x1f < bStack_3f) * '\x1f' | (0x1f >= bStack_3f) * bStack_3f) ==
                    bStack_3f);
      auVar15[10] = -((byte)((0x1f < bStack_3e) * '\x1f' | (0x1f >= bStack_3e) * bStack_3e) ==
                     bStack_3e);
      auVar15[0xb] = -((byte)((0x1f < bStack_3d) * '\x1f' | (0x1f >= bStack_3d) * bStack_3d) ==
                      bStack_3d);
      auVar15[0xc] = -((byte)((0x1f < bStack_3c) * '\x1f' | (0x1f >= bStack_3c) * bStack_3c) ==
                      bStack_3c);
      auVar15[0xd] = -((byte)((0x1f < bStack_3b) * '\x1f' | (0x1f >= bStack_3b) * bStack_3b) ==
                      bStack_3b);
      auVar15[0xe] = -((byte)((0x1f < bStack_3a) * '\x1f' | (0x1f >= bStack_3a) * bStack_3a) ==
                      bStack_3a);
      auVar15[0xf] = -((byte)((0x1f < bStack_39) * '\x1f' | (0x1f >= bStack_39) * bStack_39) ==
                      bStack_39);
      auVar15 = auVar15 | auVar16 | auVar14;
      uVar5 = (ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar15[0xf] >> 7) << 0xf;
      if (uVar5 == 0) {
        local_78.length_ = local_78.length_ + 0x10;
        if ((long)(local_78.stack_)->stackEnd_ - (long)(local_78.stack_)->stackTop_ < 0x10) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,0x10);
        }
        pauVar3 = (undefined1 (*) [16])pSVar7->stackTop_;
        pSVar7->stackTop_ = (char *)(pauVar3 + 1);
        auVar6[1] = bStack_47;
        auVar6[0] = local_48;
        auVar6[2] = bStack_46;
        auVar6[3] = bStack_45;
        auVar6[4] = bStack_44;
        auVar6[5] = bStack_43;
        auVar6[6] = bStack_42;
        auVar6[7] = bStack_41;
        auVar6[8] = bStack_40;
        auVar6[9] = bStack_3f;
        auVar6[10] = bStack_3e;
        auVar6[0xb] = bStack_3d;
        auVar6[0xc] = bStack_3c;
        auVar6[0xd] = bStack_3b;
        auVar6[0xe] = bStack_3a;
        auVar6[0xf] = bStack_39;
        *pauVar3 = auVar6;
      }
      else {
        uVar9 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        if (uVar9 != 0) {
          count = (ulong)(uVar9 & 0xffff);
          local_78.length_ = local_78.length_ + (uVar9 & 0xffff);
          if ((long)(local_78.stack_)->stackEnd_ - (long)(local_78.stack_)->stackTop_ < (long)count)
          {
            internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,count);
          }
          pcVar4 = pSVar7->stackTop_;
          pSVar7->stackTop_ = pcVar4 + count;
          lVar11 = 0;
          do {
            pcVar4[lVar11] = pbVar12[lVar11];
            lVar11 = lVar11 + 1;
          } while (count + (count == 0) != lVar11);
          pbVar12 = pbVar12 + count;
        }
      }
      if (uVar5 != 0) break;
      pbVar12 = pbVar12 + 0x10;
    }
LAB_0014219b:
    pSVar7 = local_78.stack_;
    bVar13 = *pbVar12;
    if (bVar13 != 0x5c) {
      if (bVar13 == 0x22) {
        local_68.src_ = (Ch *)(pbVar12 + 1);
        if ((local_78.stack_)->stackEnd_ == (local_78.stack_)->stackTop_ ||
            (long)(local_78.stack_)->stackEnd_ - (long)(local_78.stack_)->stackTop_ < 0) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,1);
        }
        pcVar4 = pSVar7->stackTop_;
        pSVar7->stackTop_ = pcVar4 + 1;
        *pcVar4 = '\0';
        local_78.length_ = local_78.length_ + 1;
LAB_00142352:
        if (*(int *)(this + 0x30) == 0) {
          pcVar4 = (local_78.stack_)->stackTop_;
          (local_78.stack_)->stackTop_ = pcVar4 + -(ulong)local_78.length_;
          bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::String(local_50,pcVar4 + -(ulong)local_78.length_,local_78.length_ - 1,true);
          if (!bVar8) {
            *(undefined4 *)(this + 0x30) = 0x10;
            *(long *)(this + 0x38) = (long)local_68.src_ - (long)local_68.head_;
          }
        }
        local_58->src_ = local_68.src_;
        local_58->head_ = local_68.head_;
        return;
      }
      if (bVar13 < 0x20) {
        if (bVar13 == 0) {
          *(undefined4 *)(this + 0x30) = 0xb;
        }
        else {
          *(undefined4 *)(this + 0x30) = 0xc;
        }
        *(long *)(this + 0x38) = (long)pbVar12 - (long)local_68.head_;
        local_68.src_ = (Ch *)pbVar12;
        goto LAB_00142352;
      }
      local_68.src_ = (Ch *)(pbVar12 + 1);
      bVar13 = *pbVar12;
      if ((local_78.stack_)->stackEnd_ == (local_78.stack_)->stackTop_ ||
          (long)(local_78.stack_)->stackEnd_ - (long)(local_78.stack_)->stackTop_ < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,1);
      }
LAB_001421dc:
      pbVar1 = (byte *)pSVar7->stackTop_;
      pSVar7->stackTop_ = (char *)(pbVar1 + 1);
      *pbVar1 = bVar13;
      local_78.length_ = local_78.length_ + 1;
      goto LAB_0014202c;
    }
    escapeOffset = (long)pbVar12 - (long)local_68.head_;
    local_68.src_ = (Ch *)(pbVar12 + 1);
    bVar13 = ParseStringToStream<160u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>(rapidjson::GenericStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>&)
             ::escape[pbVar12[1]];
    if (bVar13 != 0) {
      local_68.src_ = (Ch *)(pbVar12 + 2);
      if ((local_78.stack_)->stackEnd_ == (local_78.stack_)->stackTop_ ||
          (long)(local_78.stack_)->stackEnd_ - (long)(local_78.stack_)->stackTop_ < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,1);
      }
      goto LAB_001421dc;
    }
    if (pbVar12[1] != 0x75) {
      *(undefined4 *)(this + 0x30) = 10;
LAB_001423d6:
      *(size_t *)(this + 0x38) = escapeOffset;
      goto LAB_00142352;
    }
    local_68.src_ = (Ch *)(pbVar12 + 2);
    uVar9 = ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                      ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                        *)this,&local_68,escapeOffset);
    if (*(int *)(this + 0x30) != 0) goto LAB_00142352;
    if ((uVar9 & 0xfffffc00) == 0xd800) {
      pbVar1 = (byte *)local_68.src_;
      if ((*local_68.src_ != 0x5c) ||
         (pbVar1 = (byte *)(local_68.src_ + 1), local_68.src_[1] != 0x75)) {
        local_68.src_ = (Ch *)pbVar1;
        *(undefined4 *)(this + 0x30) = 9;
        goto LAB_001423d6;
      }
      local_68.src_ = local_68.src_ + 2;
      uVar10 = ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                         ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)this,&local_68,escapeOffset);
      if (*(int *)(this + 0x30) == 0) {
        if (uVar10 - 0xe000 < 0xfffffc00) {
          *(undefined4 *)(this + 0x30) = 9;
          *(size_t *)(this + 0x38) = escapeOffset;
          goto LAB_001422ff;
        }
        uVar9 = uVar9 * 0x400 + uVar10 + 0xfca02400;
        bVar8 = true;
      }
      else {
LAB_001422ff:
        bVar8 = false;
      }
      if (!bVar8) goto LAB_00142352;
    }
    UTF8<char>::
    Encode<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
              (&local_78,uVar9);
  } while( true );
}

Assistant:

void ParseString(InputStream& is, Handler& handler, bool isKey = false) {
        internal::StreamLocalCopy<InputStream> copy(is);
        InputStream& s(copy.s);

        RAPIDJSON_ASSERT(s.Peek() == '\"');
        s.Take();  // Skip '\"'

        bool success = false;
        if (parseFlags & kParseInsituFlag) {
            typename InputStream::Ch *head = s.PutBegin();
            ParseStringToStream<parseFlags, SourceEncoding, SourceEncoding>(s, s);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            size_t length = s.PutEnd(head) - 1;
            RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
            const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
            success = (isKey ? handler.Key(str, SizeType(length), false) : handler.String(str, SizeType(length), false));
        }
        else {
            StackStream<typename TargetEncoding::Ch> stackStream(stack_);
            ParseStringToStream<parseFlags, SourceEncoding, TargetEncoding>(s, stackStream);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            SizeType length = static_cast<SizeType>(stackStream.Length()) - 1;
            const typename TargetEncoding::Ch* const str = stackStream.Pop();
            success = (isKey ? handler.Key(str, length, true) : handler.String(str, length, true));
        }
        if (RAPIDJSON_UNLIKELY(!success))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
    }